

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrfile.c
# Opt level: O0

int stream_read(int hdl,void *buffer,long nbytes)

{
  size_t sVar1;
  size_t in_RDX;
  void *in_RSI;
  int in_EDI;
  long nread;
  undefined4 local_4;
  
  if (in_EDI == 1) {
    sVar1 = fread(in_RSI,1,in_RDX,_stdin);
    if (sVar1 == in_RDX) {
      local_4 = 0;
    }
    else {
      local_4 = 0x6b;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int stream_read(int hdl, void *buffer, long nbytes)
/*
     reading from stdin stream 
*/

{
    long nread;
    
    if (hdl != 1)
       return(1);  /* can only read from stdin */

    nread = (long) fread(buffer, 1, nbytes, stdin);

    if (nread != nbytes)
    {
/*        return(READ_ERROR); */
        return(END_OF_FILE);
    }

    return(0);
}